

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subprocess-posix.cc
# Opt level: O2

ExitStatus __thiscall Subprocess::Finish(Subprocess *this)

{
  __pid_t _Var1;
  uint uVar2;
  int *piVar3;
  char *pcVar4;
  int status;
  
  if (this->pid_ == -1) {
    __assert_fail("pid_ != -1",
                  "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/subprocess-posix.cc"
                  ,0x98,"ExitStatus Subprocess::Finish()");
  }
  _Var1 = waitpid(this->pid_,&status,0);
  if (-1 < _Var1) {
    this->pid_ = -1;
    uVar2 = status & 0x7f;
    if (uVar2 == 0) {
      if ((status & 0xff00U) == 0) {
        return ExitSuccess;
      }
    }
    else if (((0x1ffffff < (int)(uVar2 * 0x1000000 + 0x1000000)) && (uVar2 < 0x10)) &&
            ((0x8006U >> (status & 0x1fU) & 1) != 0)) {
      return ExitInterrupted;
    }
    return ExitFailure;
  }
  uVar2 = this->pid_;
  piVar3 = __errno_location();
  pcVar4 = strerror(*piVar3);
  Fatal("waitpid(%d): %s",(ulong)uVar2,pcVar4);
}

Assistant:

ExitStatus Subprocess::Finish() {
  assert(pid_ != -1);
  int status;
  if (waitpid(pid_, &status, 0) < 0)
    Fatal("waitpid(%d): %s", pid_, strerror(errno));
  pid_ = -1;

#ifdef _AIX
  if (WIFEXITED(status) && WEXITSTATUS(status) & 0x80) {
    // Map the shell's exit code used for signal failure (128 + signal) to the
    // status code expected by AIX WIFSIGNALED and WTERMSIG macros which, unlike
    // other systems, uses a different bit layout.
    int signal = WEXITSTATUS(status) & 0x7f;
    status = (signal << 16) | signal;
  }
#endif

  if (WIFEXITED(status)) {
    int exit = WEXITSTATUS(status);
    if (exit == 0)
      return ExitSuccess;
  } else if (WIFSIGNALED(status)) {
    if (WTERMSIG(status) == SIGINT || WTERMSIG(status) == SIGTERM
        || WTERMSIG(status) == SIGHUP)
      return ExitInterrupted;
  }
  return ExitFailure;
}